

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_binary<unsigned_short>
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,input_format_t format,unsigned_short len,binary_t *result)

{
  pointer *ppuVar1;
  uchar uVar2;
  byte *pbVar3;
  iterator __position;
  bool bVar4;
  undefined4 in_EAX;
  uint uVar5;
  undefined6 in_register_00000012;
  ushort uVar6;
  bool bVar7;
  undefined4 uStack_38;
  input_format_t local_34;
  
  _uStack_38 = CONCAT44(format,in_EAX);
  if ((int)CONCAT62(in_register_00000012,len) == 0) {
    bVar7 = true;
  }
  else {
    bVar7 = false;
    uVar6 = 1;
    do {
      this->chars_read = this->chars_read + 1;
      pbVar3 = (byte *)(this->ia).current;
      uVar5 = 0xffffffff;
      if (pbVar3 != (byte *)(this->ia).end) {
        uVar5 = (uint)*pbVar3;
        (this->ia).current = (char *)(pbVar3 + 1);
      }
      this->current = uVar5;
      bVar4 = unexpect_eof(this,local_34,"binary");
      if (!bVar4) {
        return bVar7;
      }
      uVar2 = (uchar)this->current;
      uStack_38 = CONCAT13(uVar2,(undefined3)uStack_38);
      __position._M_current =
           (result->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (result->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&result->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__position,
                   (uchar *)((long)&uStack_38 + 3));
      }
      else {
        *__position._M_current = uVar2;
        ppuVar1 = &(result->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      bVar7 = len <= uVar6;
      bVar4 = uVar6 != len;
      uVar6 = uVar6 + 1;
    } while (bVar4);
  }
  return bVar7;
}

Assistant:

bool get_binary(const input_format_t format,
                    const NumberType len,
                    binary_t& result)
    {
        bool success = true;
        for (NumberType i = 0; i < len; i++)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(format, "binary")))
            {
                success = false;
                break;
            }
            result.push_back(static_cast<std::uint8_t>(current));
        }
        return success;
    }